

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinterface.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,QNetworkAddressEntry *entry)

{
  _Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false> _Var1;
  QHostAddress *pQVar2;
  uint *puVar3;
  bool bVar4;
  long *plVar5;
  long *in_RDX;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QDebugStateSaver saver;
  _Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false> local_88;
  undefined1 local_80 [8];
  _Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false> local_78;
  undefined1 local_70 [8];
  _Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false> local_68;
  undefined1 local_60 [8];
  undefined1 *local_58;
  QHostAddress local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)entry);
  plVar5 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar5 + 0x30) = 0;
  _Var1._M_head_impl =
       (entry->d)._M_t.
       super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
       .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl;
  QVar6.m_data = (storage_type *)0xa;
  QVar6.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<((QTextStream *)_Var1._M_head_impl,(QString *)local_50);
  if (local_50[0].d.d.ptr != (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0) {
    LOCK();
    *(int *)local_50[0].d.d.ptr = *(int *)local_50[0].d.d.ptr + -1;
    UNLOCK();
    if (*(int *)local_50[0].d.d.ptr == 0) {
      QArrayData::deallocate((QArrayData *)local_50[0].d.d.ptr,2,0x10);
    }
  }
  local_68._M_head_impl =
       (entry->d)._M_t.
       super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
       .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl;
  if (*(QTextStream *)&(local_68._M_head_impl)->netmask == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_68._M_head_impl,' ');
    local_68._M_head_impl =
         (entry->d)._M_t.
         super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
         ._M_t.
         super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
         .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl;
  }
  puVar3 = &((local_68._M_head_impl)->validityLifetime).t2;
  *puVar3 = *puVar3 + 1;
  QHostAddress::QHostAddress(local_50,(QHostAddress *)*in_RDX);
  operator<<((Stream *)local_60,(QHostAddress *)&local_68);
  QDebug::~QDebug((QDebug *)local_60);
  QHostAddress::~QHostAddress(local_50);
  QDebug::~QDebug((QDebug *)&local_68);
  pQVar2 = (QHostAddress *)*in_RDX;
  QHostAddress::protocol(pQVar2);
  QNetmask::address((QNetmask *)local_50,(int)pQVar2 + 0x30);
  bVar4 = QHostAddress::isNull(local_50);
  QHostAddress::~QHostAddress(local_50);
  if (!bVar4) {
    _Var1._M_head_impl =
         (entry->d)._M_t.
         super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
         ._M_t.
         super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
         .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl;
    QVar7.m_data = (storage_type *)0xc;
    QVar7.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<((QTextStream *)_Var1._M_head_impl,(QString *)local_50);
    if (local_50[0].d.d.ptr != (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0) {
      LOCK();
      *(int *)local_50[0].d.d.ptr = *(int *)local_50[0].d.d.ptr + -1;
      UNLOCK();
      if (*(int *)local_50[0].d.d.ptr == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].d.d.ptr,2,0x10);
      }
    }
    local_78._M_head_impl =
         (entry->d)._M_t.
         super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
         ._M_t.
         super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
         .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl;
    if (*(QTextStream *)&(local_78._M_head_impl)->netmask == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_78._M_head_impl,' ');
      local_78._M_head_impl =
           (entry->d)._M_t.
           super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
           .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl;
    }
    puVar3 = &((local_78._M_head_impl)->validityLifetime).t2;
    *puVar3 = *puVar3 + 1;
    pQVar2 = (QHostAddress *)*in_RDX;
    QHostAddress::protocol(pQVar2);
    QNetmask::address((QNetmask *)local_50,(int)pQVar2 + 0x30);
    operator<<((Stream *)local_70,(QHostAddress *)&local_78);
    QDebug::~QDebug((QDebug *)local_70);
    QHostAddress::~QHostAddress(local_50);
    QDebug::~QDebug((QDebug *)&local_78);
  }
  QHostAddress::QHostAddress(local_50,(QHostAddress *)(*in_RDX + 8));
  bVar4 = QHostAddress::isNull(local_50);
  QHostAddress::~QHostAddress(local_50);
  if (!bVar4) {
    _Var1._M_head_impl =
         (entry->d)._M_t.
         super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
         ._M_t.
         super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
         .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl;
    QVar8.m_data = (storage_type *)0xe;
    QVar8.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<((QTextStream *)_Var1._M_head_impl,(QString *)local_50);
    if (local_50[0].d.d.ptr != (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0) {
      LOCK();
      *(int *)local_50[0].d.d.ptr = *(int *)local_50[0].d.d.ptr + -1;
      UNLOCK();
      if (*(int *)local_50[0].d.d.ptr == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].d.d.ptr,2,0x10);
      }
    }
    local_88._M_head_impl =
         (entry->d)._M_t.
         super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
         ._M_t.
         super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
         .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl;
    if (*(QTextStream *)&(local_88._M_head_impl)->netmask == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_88._M_head_impl,' ');
      local_88._M_head_impl =
           (entry->d)._M_t.
           super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
           .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl;
    }
    puVar3 = &((local_88._M_head_impl)->validityLifetime).t2;
    *puVar3 = *puVar3 + 1;
    QHostAddress::QHostAddress(local_50,(QHostAddress *)(*in_RDX + 8));
    operator<<((Stream *)local_80,(QHostAddress *)&local_88);
    QDebug::~QDebug((QDebug *)local_80);
    QHostAddress::~QHostAddress(local_50);
    QDebug::~QDebug((QDebug *)&local_88);
  }
  _Var1._M_head_impl =
       (entry->d)._M_t.
       super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
       .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl;
  (entry->d)._M_t.
  super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
  ._M_t.
  super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
  .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl =
       (QNetworkAddressEntryPrivate *)0x0;
  *(QNetworkAddressEntryPrivate **)debug.stream = _Var1._M_head_impl;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QNetworkAddressEntry &entry)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    debug << "address = " << entry.ip();
    if (!entry.netmask().isNull())
        debug << ", netmask = " << entry.netmask();
    if (!entry.broadcast().isNull())
        debug << ", broadcast = " << entry.broadcast();
    return debug;
}